

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_SimpleString_startsWith_TestShell::createTest(TEST_SimpleString_startsWith_TestShell *this)

{
  TEST_SimpleString_startsWith_Test *this_00;
  TEST_SimpleString_startsWith_TestShell *this_local;
  
  this_00 = (TEST_SimpleString_startsWith_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x160);
  TEST_SimpleString_startsWith_Test::TEST_SimpleString_startsWith_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, startsWith)
{
    SimpleString hi("Hi you!");
    SimpleString part("Hi");
    SimpleString diff("Hrrm Hi you! ffdsfd");
    CHECK(hi.startsWith(part));
    CHECK(!part.startsWith(hi));
    CHECK(!diff.startsWith(hi));
}